

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O3

int calc_size(adiak_datatype_t *datatype)

{
  adiak_type_t aVar1;
  int iVar2;
  adiak_datatype_t **ppaVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = 1;
  for (; aVar1 = datatype->dtype, aVar1 - adiak_range < 3; datatype = *datatype->subtype) {
    iVar6 = iVar6 * (datatype->num_ref_elements + datatype->num_elements);
  }
  if (aVar1 < (adiak_longlong|adiak_ulong)) {
    if ((0x30fe6U >> (aVar1 & (adiak_longlong|adiak_tuple)) & 1) != 0) {
      iVar5 = 8;
      goto LAB_0010251a;
    }
    if ((0x18U >> (aVar1 & (adiak_longlong|adiak_tuple)) & 1) != 0) {
      iVar5 = 4;
      goto LAB_0010251a;
    }
    if (aVar1 == adiak_tuple) {
      iVar2 = datatype->num_subtypes;
      if ((long)iVar2 < 1) {
        iVar5 = 0;
      }
      else {
        ppaVar3 = datatype->subtype;
        lVar7 = 0;
        iVar5 = 0;
        do {
          iVar4 = calc_size(ppaVar3[lVar7]);
          iVar5 = iVar5 + iVar4;
          lVar7 = lVar7 + 1;
        } while (iVar2 != lVar7);
      }
      goto LAB_0010251a;
    }
  }
  iVar5 = -1;
LAB_0010251a:
  return iVar5 * iVar6;
}

Assistant:

static int calc_size(adiak_datatype_t* datatype)
{
   switch (datatype->dtype) {
      case adiak_type_unset:
         return -1;
      case adiak_long:
      case adiak_ulong:
      case adiak_date:
         return sizeof(long);
      case adiak_longlong:
      case adiak_ulonglong:
         return sizeof(long long);
      case adiak_int:
      case adiak_uint:
         return sizeof(int);
      case adiak_double:
         return sizeof(double);
      case adiak_timeval:
         return sizeof(struct timeval *);
      case adiak_version:
      case adiak_string:
      case adiak_catstring:
      case adiak_path:
         return sizeof(char *);
      case adiak_range:
      case adiak_set:
      case adiak_list: {
         int num_elements = datatype->num_elements + datatype->num_ref_elements;
         return (num_elements * calc_size(datatype->subtype[0]));
      }
      case adiak_tuple: {
         int bytes = 0;
         for (int i = 0; i < datatype->num_subtypes; ++i)
            bytes += calc_size(datatype->subtype[i]);
         return bytes;
      }
   }
   return -1;
}